

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O0

void __thiscall despot::POMCP::POMCP(POMCP *this,DSPOMDP *model,POMCPPrior *prior,Belief *belief)

{
  Belief *belief_local;
  POMCPPrior *prior_local;
  DSPOMDP *model_local;
  POMCP *this_local;
  
  Solver::Solver(&this->super_Solver,model,belief);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__POMCP_0026f108;
  this->root_ = (VNode *)0x0;
  this->reuse_ = false;
  this->prior_ = prior;
  if (this->prior_ != (POMCPPrior *)0x0) {
    return;
  }
  __assert_fail("prior_ != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/solver/pomcp.cpp"
                ,0x40,"despot::POMCP::POMCP(const DSPOMDP *, POMCPPrior *, Belief *)");
}

Assistant:

POMCP::POMCP(const DSPOMDP* model, POMCPPrior* prior, Belief* belief) :
	Solver(model, belief),
	root_(NULL) {
	reuse_ = false;
	prior_ = prior;
	assert(prior_ != NULL);
}